

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall icu_63::DecimalFormat::setLenient(DecimalFormat *this,UBool enable)

{
  DecimalFormatProperties *pDVar1;
  uint in_EAX;
  UErrorCode localStatus;
  undefined8 uStack_18;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (((pDVar1->parseMode).fNull != false) || ((pDVar1->parseMode).fValue != (uint)(enable == '\0'))
     ) {
    uStack_18._0_4_ = in_EAX;
    NumberFormat::setLenient(&this->super_NumberFormat,enable);
    pDVar1 = (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    (pDVar1->parseMode).fValue = (uint)(enable == '\0');
    (pDVar1->parseMode).fNull = false;
    uStack_18 = (ulong)(uint)uStack_18;
    touch(this,(UErrorCode *)((long)&uStack_18 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setLenient(UBool enable) {
    ParseMode mode = enable ? PARSE_MODE_LENIENT : PARSE_MODE_STRICT;
    if (!fields->properties->parseMode.isNull() && mode == fields->properties->parseMode.getNoError()) { return; }
    NumberFormat::setLenient(enable); // to set field for compatibility
    fields->properties->parseMode = mode;
    touchNoError();
}